

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::IsMatch
          (MessageDifferencer *this,FieldDescriptor *repeated_field,MapKeyComparator *key_comparator
          ,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields,Reporter *reporter,int index1,int index2)

{
  Reporter *pRVar1;
  string *psVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  Message *pMVar6;
  Message *pMVar7;
  Metadata MVar8;
  Metadata MVar9;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  value_type local_90;
  
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::vector(&current_parent_fields,parent_fields);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)repeated_field->type_ * 4) == 10) {
    pRVar1 = this->reporter_;
    psVar2 = this->output_string_;
    this->reporter_ = reporter;
    this->output_string_ = (string *)0x0;
    if (key_comparator == (MapKeyComparator *)0x0) {
      uVar4 = CompareFieldValueUsingParentFields
                        (this,message1,message2,unpacked_any,repeated_field,index1,index2,
                         &current_parent_fields);
    }
    else {
      MVar8 = Message::GetMetadata(message1);
      MVar9 = Message::GetMetadata(message2);
      pMVar6 = Reflection::GetRepeatedMessage(MVar8.reflection,message1,repeated_field,index1);
      pMVar7 = Reflection::GetRepeatedMessage(MVar9.reflection,message2,repeated_field,index2);
      local_90.unknown_field_number = -1;
      local_90.unknown_field_type = TYPE_VARINT;
      local_90.map_entry1 = (Message *)0x0;
      local_90.map_entry2 = (Message *)0x0;
      local_90.unknown_field_set1 = (UnknownFieldSet *)0x0;
      local_90.unknown_field_set2 = (UnknownFieldSet *)0x0;
      local_90.unknown_field_index1 = -1;
      local_90.unknown_field_index2 = -1;
      local_90.forced_compare_no_presence_ = false;
      local_90.message1 = message1;
      local_90.message2 = message2;
      local_90.unpacked_any = unpacked_any;
      local_90.field = repeated_field;
      bVar3 = FieldDescriptor::is_map(repeated_field);
      if (bVar3) {
        local_90.map_entry1 = pMVar6;
        local_90.map_entry2 = pMVar7;
      }
      local_90.index = index1;
      local_90.new_index = index2;
      std::
      vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ::push_back(&current_parent_fields,&local_90);
      iVar5 = (*key_comparator->_vptr_MapKeyComparator[2])
                        (key_comparator,pMVar6,pMVar7,0,&current_parent_fields);
      uVar4 = (undefined1)iVar5;
    }
    this->reporter_ = pRVar1;
    this->output_string_ = psVar2;
  }
  else {
    uVar4 = CompareFieldValueUsingParentFields
                      (this,message1,message2,unpacked_any,repeated_field,index1,index2,
                       &current_parent_fields);
  }
  std::
  _Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::~_Vector_base(&current_parent_fields.
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 );
  return (bool)uVar4;
}

Assistant:

bool MessageDifferencer::IsMatch(
    const FieldDescriptor* repeated_field,
    const MapKeyComparator* key_comparator, const Message* message1,
    const Message* message2, int unpacked_any,
    const std::vector<SpecificField>& parent_fields, Reporter* reporter,
    int index1, int index2) {
  std::vector<SpecificField> current_parent_fields(parent_fields);
  if (repeated_field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    return CompareFieldValueUsingParentFields(
        *message1, *message2, unpacked_any, repeated_field, index1, index2,
        &current_parent_fields);
  }
  // Back up the Reporter and output_string_.  They will be reset in the
  // following code.
  Reporter* backup_reporter = reporter_;
  std::string* output_string = output_string_;
  reporter_ = reporter;
  output_string_ = nullptr;
  bool match;

  if (key_comparator == nullptr) {
    match = CompareFieldValueUsingParentFields(
        *message1, *message2, unpacked_any, repeated_field, index1, index2,
        &current_parent_fields);
  } else {
    const Reflection* reflection1 = message1->GetReflection();
    const Reflection* reflection2 = message2->GetReflection();
    const Message& m1 =
        reflection1->GetRepeatedMessage(*message1, repeated_field, index1);
    const Message& m2 =
        reflection2->GetRepeatedMessage(*message2, repeated_field, index2);
    SpecificField specific_field;
    specific_field.message1 = message1;
    specific_field.message2 = message2;
    specific_field.unpacked_any = unpacked_any;
    specific_field.field = repeated_field;
    if (repeated_field->is_map()) {
      specific_field.map_entry1 = &m1;
      specific_field.map_entry2 = &m2;
    }
    specific_field.index = index1;
    specific_field.new_index = index2;
    current_parent_fields.push_back(specific_field);
    match = key_comparator->IsMatch(m1, m2, false, current_parent_fields);
  }

  reporter_ = backup_reporter;
  output_string_ = output_string;
  return match;
}